

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void PrintGraph(InstructionVMGraphContext *ctx,VmModule *module)

{
  VmFunction *function;
  IntrusiveList<VmFunction> *pIVar1;
  
  ctx->code = module->code;
  pIVar1 = &module->functions;
  while (function = pIVar1->head, function != (VmFunction *)0x0) {
    PrintFunction(ctx,function);
    pIVar1 = (IntrusiveList<VmFunction> *)&function->next;
  }
  PrintLine(ctx,"// Peephole optimizations: %d",(ulong)module->peepholeOptimizations);
  PrintLine(ctx,"// Constant propagations: %d",(ulong)module->constantPropagations);
  PrintLine(ctx,"// Dead code eliminations: %d",(ulong)module->deadCodeEliminations);
  PrintLine(ctx,"// Control flow simplifications: %d",(ulong)module->controlFlowSimplifications);
  PrintLine(ctx,"// Load store propagation: %d",(ulong)module->loadStorePropagations);
  PrintLine(ctx,"// Common subexpression eliminations: %d",(ulong)module->commonSubexprEliminations)
  ;
  PrintLine(ctx,"// Dead alloca store eliminations: %d",(ulong)module->deadAllocaStoreEliminations);
  PrintLine(ctx,"// Function inlines: %d",(ulong)module->functionInlines);
  OutputContext::Flush(ctx->output);
  return;
}

Assistant:

void PrintGraph(InstructionVMGraphContext &ctx, VmModule *module)
{
	ctx.code = module->code;

	for(VmFunction *value = module->functions.head; value; value = value->next)
		PrintFunction(ctx, value);

	PrintLine(ctx, "// Peephole optimizations: %d", module->peepholeOptimizations);
	PrintLine(ctx, "// Constant propagations: %d", module->constantPropagations);
	PrintLine(ctx, "// Dead code eliminations: %d", module->deadCodeEliminations);
	PrintLine(ctx, "// Control flow simplifications: %d", module->controlFlowSimplifications);
	PrintLine(ctx, "// Load store propagation: %d", module->loadStorePropagations);
	PrintLine(ctx, "// Common subexpression eliminations: %d", module->commonSubexprEliminations);
	PrintLine(ctx, "// Dead alloca store eliminations: %d", module->deadAllocaStoreEliminations);
	PrintLine(ctx, "// Function inlines: %d", module->functionInlines);

	ctx.output.Flush();
}